

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

ImFont * __thiscall
ImFontAtlas::AddFontFromMemoryCompressedBase85TTF
          (ImFontAtlas *this,char *compressed_ttf_data_base85,float size_pixels,
          ImFontConfig *font_cfg,ImWchar *glyph_ranges)

{
  char cVar1;
  size_t sVar2;
  int *compressed_ttf_data;
  int *piVar3;
  ImFont *pIVar4;
  
  sVar2 = strlen(compressed_ttf_data_base85);
  compressed_ttf_data = (int *)ImGui::MemAlloc((long)(((int)sVar2 + 4) / 5 << 2));
  piVar3 = compressed_ttf_data;
  while( true ) {
    cVar1 = *compressed_ttf_data_base85;
    if (cVar1 == '\0') break;
    *piVar3 = (((((0x5b < compressed_ttf_data_base85[4] ^ 0xffffffdd) +
                 (int)compressed_ttf_data_base85[4]) * 0x55 +
                (0x5b < compressed_ttf_data_base85[3] ^ 0xffffffdd) +
                (int)compressed_ttf_data_base85[3]) * 0x55 +
               (0x5b < compressed_ttf_data_base85[2] ^ 0xffffffdd) +
               (int)compressed_ttf_data_base85[2]) * 0x55 +
              (0x5b < compressed_ttf_data_base85[1] ^ 0xffffffdd) +
              (int)compressed_ttf_data_base85[1]) * 0x55 + ('[' < cVar1 ^ 0xffffffdd) + (int)cVar1;
    compressed_ttf_data_base85 = compressed_ttf_data_base85 + 5;
    piVar3 = piVar3 + 1;
  }
  pIVar4 = AddFontFromMemoryCompressedTTF
                     (this,compressed_ttf_data,(int)cVar1,size_pixels,font_cfg,glyph_ranges);
  ImGui::MemFree(compressed_ttf_data);
  return pIVar4;
}

Assistant:

ImFont* ImFontAtlas::AddFontFromMemoryCompressedBase85TTF(const char* compressed_ttf_data_base85, float size_pixels, const ImFontConfig* font_cfg, const ImWchar* glyph_ranges)
{
    int compressed_ttf_size = (((int)strlen(compressed_ttf_data_base85) + 4) / 5) * 4;
    void* compressed_ttf = IM_ALLOC((size_t)compressed_ttf_size);
    Decode85((const unsigned char*)compressed_ttf_data_base85, (unsigned char*)compressed_ttf);
    ImFont* font = AddFontFromMemoryCompressedTTF(compressed_ttf, compressed_ttf_size, size_pixels, font_cfg, glyph_ranges);
    IM_FREE(compressed_ttf);
    return font;
}